

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O2

void __thiscall csm::Plugin::Plugin(Plugin *this)

{
  Impl *impl;
  Locker locker;
  Plugin *local_18;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_001297e8;
  if (theList_abi_cxx11_ == (_List_node_base *)0x0) {
    theList_abi_cxx11_ = (_List_node_base *)operator_new(0x18);
    theList_abi_cxx11_->_M_prev = theList_abi_cxx11_;
    theList_abi_cxx11_->_M_next = theList_abi_cxx11_;
    theList_abi_cxx11_[1]._M_next = (_List_node_base *)0x0;
  }
  impl = Plugin::impl();
  Impl::Locker::Locker(&locker,impl);
  local_18 = this;
  std::__cxx11::list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_>::push_back
            ((list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *)theList_abi_cxx11_,
             &local_18);
  Impl::Locker::~Locker(&locker);
  return;
}

Assistant:

Plugin::Plugin()
{
   //---
   // If the list of registered sensor model factories does not exist yet, then
   // create it.
   //---
   if (!theList) theList = new PluginList();

   //---
   // If the list of registered sensor model factories exists now (i.e., no
   // error occurred while creating it), then register the plugin factory in
   // theList by adding a pointer to this list.
   //    The pointer points to the static instance of the derived sensor
   // model plugin.
   //---
   if (theList)
   {
      Impl::Locker locker(impl());

      theList->push_back(this);
   }
}